

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnViewPrivate::~QColumnViewPrivate(QColumnViewPrivate *this)

{
  *(undefined ***)
   &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
    super_QWidgetPrivate = &PTR__QColumnViewPrivate_007e6dd8;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  ::~QHash(&this->viewConnections);
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::~vector
            (&this->gripConnections);
  QMetaObject::Connection::~Connection(&this->animationConnection);
  QPropertyAnimation::~QPropertyAnimation(&this->currentAnimation);
  QArrayDataPointer<int>::~QArrayDataPointer(&(this->columnSizes).d);
  QArrayDataPointer<QAbstractItemView_*>::~QArrayDataPointer(&(this->columns).d);
  QAbstractItemViewPrivate::~QAbstractItemViewPrivate(&this->super_QAbstractItemViewPrivate);
  return;
}

Assistant:

QColumnViewPrivate::~QColumnViewPrivate()
{
}